

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
* __thiscall
discordpp::
field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
::operator=(field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
            *this,field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                  *f)

{
  _Head_base<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_false>
  __rhs;
  pointer __p;
  
  __rhs._M_head_impl =
       (f->t_)._M_t.
       super___uniq_ptr_impl<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
       .
       super__Head_base<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_false>
       ._M_head_impl;
  if (__rhs._M_head_impl ==
      (variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
       *)0x0) {
    __p = (pointer)0x0;
  }
  else {
    __p = (pointer)operator_new(0x128);
    std::__detail::__variant::
    _Copy_ctor_base<false,_discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
                       *)__p,(_Copy_ctor_base<false,_discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
                              *)__rhs._M_head_impl);
  }
  std::
  __uniq_ptr_impl<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
  ::reset((__uniq_ptr_impl<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
           *)this,__p);
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }